

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash32.c
# Opt level: O1

hwaddr ppc_hash32_get_phys_page_debug_ppc(PowerPCCPU_conflict *cpu,target_ulong_conflict eaddr)

{
  target_ulong_conflict sr;
  ulong uVar1;
  hwaddr hVar2;
  ppc_hash_pte32_t pte;
  int prot;
  ppc_hash_pte32_t pStack_28;
  int local_1c;
  
  uVar1 = (ulong)eaddr;
  if ((((cpu->env).msr & 0x10) != 0) &&
     (((cpu->env).nb_BATs == 0 ||
      (uVar1 = ppc_hash32_bat_lookup(cpu,eaddr,0,&local_1c), uVar1 == 0xffffffffffffffff)))) {
    sr = (cpu->env).sr[eaddr >> 0x1c];
    uVar1 = 0xffffffffffffffff;
    if ((-1 < (int)sr) &&
       (hVar2 = ppc_hash32_htab_lookup(cpu,sr,eaddr,&pStack_28), hVar2 != 0xffffffffffffffff)) {
      uVar1 = (ulong)(pStack_28.pte1 & 0xfffff000);
    }
  }
  return uVar1;
}

Assistant:

hwaddr ppc_hash32_get_phys_page_debug(PowerPCCPU *cpu, target_ulong eaddr)
{
    CPUPPCState *env = &cpu->env;
    target_ulong sr;
    hwaddr pte_offset;
    ppc_hash_pte32_t pte;
    int prot;

    if (msr_dr == 0) {
        /* Translation is off */
        return eaddr;
    }

    if (env->nb_BATs != 0) {
        hwaddr raddr = ppc_hash32_bat_lookup(cpu, eaddr, 0, &prot);
        if (raddr != -1) {
            return raddr;
        }
    }

    sr = env->sr[eaddr >> 28];

    if (sr & SR32_T) {
        /* FIXME: Add suitable debug support for Direct Store segments */
        return -1;
    }

    pte_offset = ppc_hash32_htab_lookup(cpu, sr, eaddr, &pte);
    if (pte_offset == -1) {
        return -1;
    }

    return ppc_hash32_pte_raddr(sr, pte, eaddr) & TARGET_PAGE_MASK;
}